

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O2

void flush_display_ptrregion(DLword *ybase,UNSIGNED bitoffset,int w,int h)

{
  ulong uVar1;
  
  uVar1 = (ulong)((long)ybase - (long)DisplayRegion68k) >> 1 & 0xffffffff;
  (*currentdsp->bitblt_to_screen)
            (currentdsp,DisplayRegion68k,
             (int)(uVar1 % (ulong)(displaywidth >> 4)) * 0x10 + (int)bitoffset,
             (int)(uVar1 / (displaywidth >> 4)),w,h);
  return;
}

Assistant:

void flush_display_ptrregion(DLword *ybase, UNSIGNED bitoffset, int w, int h)
{
  int y, x, baseoffset;
  baseoffset = (((DLword *)ybase) - DisplayRegion68k);
  y = baseoffset / DLWORD_PERLINE;
  x = bitoffset + (BITSPERWORD * (baseoffset - (DLWORD_PERLINE * y)));
  //  printf("flush_display_ptrregion %d %d %d %d\n", x, y, w, h);
#ifdef SDL
  sdl_notify_damage(x, y, w, h);
#endif
#if   (defined(XWINDOW) || defined(DOS))
  TPRINT(("Enter flush_display_ptrregion\n x=%d, y=%d, w=%d, h=%d\n", x, y, w, h));
  (currentdsp->bitblt_to_screen)(currentdsp, DisplayRegion68k, x, y, w, h);
  TPRINT(("Exit flush_display_ptrregion\n"));
#endif /* DOS */
}